

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

iterator __thiscall
spvtools::utils::SmallVector<unsigned_int,2ul>::insert<unsigned_int_const*>
          (SmallVector<unsigned_int,2ul> *this,iterator pos,uint *first,uint *last)

{
  bool bVar1;
  iterator puVar2;
  long __n;
  difference_type dVar3;
  pointer this_00;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  iterator local_80;
  iterator p;
  iterator j;
  iterator i;
  const_iterator local_60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  iterator new_pos;
  size_t new_size;
  size_t num_of_new_elements;
  size_t element_idx;
  uint *last_local;
  uint *first_local;
  iterator pos_local;
  SmallVector<unsigned_int,_2UL> *this_local;
  
  puVar2 = SmallVector<unsigned_int,_2UL>::begin((SmallVector<unsigned_int,_2UL> *)this);
  __n = (long)pos - (long)puVar2 >> 2;
  dVar3 = std::distance<unsigned_int_const*>(first,last);
  new_pos._M_current = (uint *)(*(long *)(this + 8) + dVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(this + 0x20));
  if ((!bVar1) && ((uint *)0x2 < new_pos._M_current)) {
    SmallVector<unsigned_int,_2UL>::MoveToLargeData((SmallVector<unsigned_int,_2UL> *)this);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(this + 0x20));
  if (bVar1) {
    this_00 = std::
              unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator->((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)(this + 0x20));
    local_58._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    local_50 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator+(&local_58,__n);
    this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
              std::
              unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator->((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)(this + 0x20));
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_60,&local_50);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int_const*,void>
              (this_01,local_60,first,last);
    puVar2 = SmallVector<unsigned_int,_2UL>::begin((SmallVector<unsigned_int,_2UL> *)this);
    this_local = (SmallVector<unsigned_int,_2UL> *)(puVar2 + __n);
  }
  else {
    puVar2 = SmallVector<unsigned_int,_2UL>::begin((SmallVector<unsigned_int,_2UL> *)this);
    j = puVar2 + (long)new_pos._M_current;
    p = SmallVector<unsigned_int,_2UL>::end((SmallVector<unsigned_int,_2UL> *)this);
    while( true ) {
      j = j + -1;
      p = p + -1;
      local_80 = pos;
      last_local = first;
      if (p < pos) break;
      puVar2 = SmallVector<unsigned_int,_2UL>::begin((SmallVector<unsigned_int,_2UL> *)this);
      if (j < puVar2 + *(long *)(this + 8)) {
        *j = *p;
      }
      else {
        *j = *p;
      }
    }
    for (; last_local != last; last_local = last_local + 1) {
      if (local_80 < (iterator)(*(long *)(this + 0x18) + *(long *)(this + 8) * 4)) {
        *local_80 = *last_local;
      }
      else {
        *local_80 = *last_local;
      }
      local_80 = local_80 + 1;
    }
    *(difference_type *)(this + 8) = dVar3 + *(long *)(this + 8);
    this_local = (SmallVector<unsigned_int,_2UL> *)pos;
  }
  return (iterator)this_local;
}

Assistant:

iterator insert(iterator pos, InputIt first, InputIt last) {
    size_t element_idx = (pos - begin());
    size_t num_of_new_elements = std::distance(first, last);
    size_t new_size = size_ + num_of_new_elements;
    if (!large_data_ && new_size > small_size) {
      MoveToLargeData();
    }

    if (large_data_) {
      typename std::vector<T>::iterator new_pos =
          large_data_->begin() + element_idx;
      large_data_->insert(new_pos, first, last);
      return begin() + element_idx;
    }

    // Move |pos| and all of the elements after it over |num_of_new_elements|
    // places.  We start at the end and work backwards, to make sure we do not
    // overwrite data that we have not moved yet.
    for (iterator i = begin() + new_size - 1, j = end() - 1; j >= pos;
         --i, --j) {
      if (i >= begin() + size_) {
        new (i) T(std::move(*j));
      } else {
        *i = std::move(*j);
      }
    }

    // Copy the new elements into position.
    iterator p = pos;
    for (; first != last; ++p, ++first) {
      if (p >= small_data_ + size_) {
        new (p) T(*first);
      } else {
        *p = *first;
      }
    }

    // Update the size.
    size_ += num_of_new_elements;
    return pos;
  }